

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::TryConsumeInteger64
          (Parser *this,uint64_t max_value,uint64_t *output)

{
  bool bVar1;
  
  if (((this->input_->current_).type == TYPE_INTEGER) &&
     (bVar1 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,max_value,output), bVar1))
  {
    io::Tokenizer::Next(this->input_);
    return true;
  }
  return false;
}

Assistant:

bool Parser::TryConsumeInteger64(uint64_t max_value, uint64_t* output) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
      io::Tokenizer::ParseInteger(input_->current().text, max_value, output)) {
    input_->Next();
    return true;
  }
  return false;
}